

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::FunctionCallArgs(SQCompiler *this,bool rawcall)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  ulong uVar4;
  long lVar5;
  SQInstruction local_30;
  
  uVar4 = 1;
  if (this->_token != 0x29) {
    do {
      Expression(this);
      MoveIfCurrentTargetIsLocal(this);
      if (this->_token == 0x2c) {
        SVar1 = SQLexer::Lex(&this->_lex);
        this->_token = SVar1;
        if (SVar1 == 0x29) {
          Error(this,"expression expected, found \')\'");
        }
      }
      uVar4 = uVar4 + 1;
    } while (this->_token != 0x29);
  }
  SVar1 = SQLexer::Lex(&this->_lex);
  this->_token = SVar1;
  if (rawcall) {
    if (uVar4 < 3) {
      Error(this,"rawcall requires at least 2 parameters (callee and this)");
    }
    uVar4 = uVar4 - 2;
  }
  if (1 < (long)uVar4) {
    lVar5 = uVar4 - 1;
    do {
      SQFuncState::PopTarget(this->_fs);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  SVar1 = SQFuncState::PopTarget(this->_fs);
  SVar2 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  SVar3 = SQFuncState::PushTarget(this_00,-1);
  local_30.op = '\x06';
  local_30._arg0 = (uchar)SVar3;
  local_30._arg1 = (SQInt32)SVar2;
  local_30._arg2 = (uchar)SVar1;
  local_30._arg3 = (uchar)uVar4;
  SQFuncState::AddInstruction(this_00,&local_30);
  return;
}

Assistant:

void FunctionCallArgs(bool rawcall = false)
    {
        SQInteger nargs = 1;//this
         while(_token != _SC(')')) {
             Expression();
             MoveIfCurrentTargetIsLocal();
             nargs++;
             if(_token == _SC(',')){
                 Lex();
                 if(_token == ')') Error(_SC("expression expected, found ')'"));
             }
         }
         Lex();
         if (rawcall) {
             if (nargs < 3) Error(_SC("rawcall requires at least 2 parameters (callee and this)"));
             nargs -= 2; //removes callee and this from count
         }
         for(SQInteger i = 0; i < (nargs - 1); i++) _fs->PopTarget();
         SQInteger stackbase = _fs->PopTarget();
         SQInteger closure = _fs->PopTarget();
         _fs->AddInstruction(_OP_CALL, _fs->PushTarget(), closure, stackbase, nargs);
    }